

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O1

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MultiFab::norm0
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MultiFab *this,
          Vector<int,_std::allocator<int>_> *comps,int nghost,bool local,bool ignore_covered)

{
  pointer piVar1;
  pointer piVar2;
  int *piVar3;
  iterator __position;
  Real in_RAX;
  int *piVar4;
  Real local_38;
  
  piVar1 = (comps->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  piVar2 = (comps->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,
             (long)(int)((ulong)((long)piVar1 - (long)piVar2) >> 2));
  piVar3 = (comps->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar4 = (comps->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar4 != piVar3; piVar4 = piVar4 + 1) {
    local_38 = norm0(this,*piVar4,nghost,false,ignore_covered);
    __position._M_current =
         (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,__position,
                 &local_38);
    }
    else {
      *__position._M_current = local_38;
      (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
MultiFab::norm0 (const Vector<int>& comps, int nghost, bool local, bool ignore_covered) const
{
    int n = comps.size();
    Vector<Real> nm0;
    nm0.reserve(n);

    for (int comp : comps) {
        nm0.push_back(this->norm0(comp, nghost, true, ignore_covered));
    }

    if (!local) {
        ParallelAllReduce::Max(nm0.dataPtr(), n, ParallelContext::CommunicatorSub());
    }

    return nm0;
}